

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::MergeScenes
               (aiScene **_dest,aiScene *master,
               vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *srcList,
               uint flags)

{
  allocator<unsigned_int> *this;
  value_type vVar1;
  aiNode *paVar2;
  aiMaterialProperty *paVar3;
  char *pcVar4;
  aiMesh *paVar5;
  aiAnimation **_dest_00;
  aiCamera **_dest_01;
  aiLight **_dest_02;
  bool bVar6;
  uint uVar7;
  int iVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  aiScene *paVar13;
  reference pNVar14;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar15;
  basic_formatter *this_01;
  ulong uVar16;
  aiAnimation **local_678;
  aiCamera **local_660;
  aiLight **local_648;
  aiScene *deleteMe;
  undefined1 local_440 [4];
  uint n_6;
  string local_2c8;
  uint local_2a4;
  iterator iStack_2a0;
  uint n_5;
  __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
  local_298;
  iterator it;
  uint local_288;
  uint a_4;
  uint i_9;
  uint i_8;
  uint i_7;
  uint a_3;
  aiMesh *mesh;
  undefined1 local_268 [4];
  uint i_6;
  aiNode *local_248;
  aiNode *node;
  SceneHelper *cur_4;
  int n_4;
  aiAnimation **local_228;
  aiAnimation **local_220;
  aiAnimation **ppAnims;
  ulong local_210;
  aiCamera **local_208;
  aiCamera **local_200;
  aiCamera **ppCameras;
  ulong local_1f0;
  aiLight **local_1e8;
  aiLight **local_1e0;
  aiLight **ppLights;
  vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> nodes;
  uint i_5;
  SceneHelper *cur_3;
  aiMesh **ppaStack_1a8;
  uint n_3;
  aiMesh **pip_2;
  aiString *pcSrc;
  uint idx;
  aiString *s;
  aiMaterialProperty *prop;
  uint a_2;
  uint i_4;
  SceneHelper *cur_2;
  aiMaterial **ppaStack_168;
  uint n_2;
  aiMaterial **pip_1;
  uint i_3;
  SceneHelper *cur_1;
  _Base_ptr p_Stack_148;
  uint n_1;
  aiTexture **pip;
  SceneHelper *cur;
  uint n;
  uint cnt;
  uint32_t local_11c;
  aiAnimation *local_118;
  aiAnimation *anim;
  uint local_108;
  uint a_1;
  uint i_2;
  uint a;
  uint i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offset;
  undefined1 local_d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> duplicates;
  uint local_60;
  allocator<Assimp::SceneHelper> local_59;
  uint i;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> src;
  aiScene *dest;
  uint flags_local;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *srcList_local;
  aiScene *master_local;
  aiScene **_dest_local;
  
  if (_dest != (aiScene **)0x0) {
    bVar6 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::empty
                      (srcList);
    if (bVar6) {
      if (*_dest == (aiScene *)0x0) {
        *_dest = master;
      }
      else {
        CopySceneFlat(_dest,master);
      }
    }
    else {
      if (*_dest == (aiScene *)0x0) {
        paVar13 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(paVar13);
        *_dest = paVar13;
      }
      else {
        aiScene::~aiScene(*_dest);
        aiScene::aiScene(*_dest);
      }
      src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*_dest;
      sVar9 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::size
                        (srcList);
      std::allocator<Assimp::SceneHelper>::allocator(&local_59);
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::vector
                ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i,sVar9 + 1,
                 &local_59);
      std::allocator<Assimp::SceneHelper>::~allocator(&local_59);
      pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                          ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i,0
                          );
      pvVar10->scene = master;
      for (local_60 = 0;
          sVar9 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::size
                            (srcList), local_60 < sVar9; local_60 = local_60 + 1) {
        pvVar11 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
                  operator[](srcList,(ulong)local_60);
        SceneHelper::SceneHelper
                  ((SceneHelper *)
                   &duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar11->scene);
        pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                            ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i
                             ,(ulong)(local_60 + 1));
        SceneHelper::operator=
                  (pvVar10,(SceneHelper *)
                           &duplicates.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        SceneHelper::~SceneHelper
                  ((SceneHelper *)
                   &duplicates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                        ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i);
      offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
      this = (allocator<unsigned_int> *)
             ((long)&offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<unsigned_int>::allocator(this);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,sVar9,
                 (value_type_conflict1 *)
                 ((long)&offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),this);
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)
                 ((long)&offset.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                        ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i);
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&a + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,sVar9,
                 (allocator<unsigned_int> *)((long)&a + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&a + 3));
      for (i_2 = 0; uVar16 = (ulong)i_2,
          sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                            ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i
                            ), uVar16 < sVar9; i_2 = i_2 + 1) {
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                             (ulong)i_2);
        if ((*pvVar12 == i_2) ||
           (pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                                 (ulong)i_2), *pvVar12 == 0xffffffff)) {
          uVar7 = i_2;
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                               (ulong)i_2);
          *pvVar12 = uVar7;
          a_1 = i_2;
          while( true ) {
            a_1 = a_1 + 1;
            uVar16 = (ulong)a_1;
            sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                              ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i);
            if (sVar9 <= uVar16) break;
            pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                      operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  *)&i,(ulong)i_2);
            paVar13 = pvVar10->scene;
            pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                      operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  *)&i,(ulong)a_1);
            uVar7 = i_2;
            if (paVar13 == pvVar10->scene) {
              pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                                   (ulong)a_1);
              *pvVar12 = uVar7;
            }
          }
        }
      }
      if ((flags & 1) != 0) {
        for (local_108 = 1; uVar16 = (ulong)local_108,
            sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                              ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i), uVar16 < sVar9; local_108 = local_108 + 1) {
          pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                    operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i,(ulong)local_108);
          uVar7 = snprintf(pvVar10->id,0x20,"$%.6X$_",(ulong)local_108);
          pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                    operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i,(ulong)local_108);
          pvVar10->idlen = uVar7;
          if ((flags & 0x10) != 0) {
            pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                      operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  *)&i,(ulong)local_108);
            paVar13 = SceneHelper::operator->(pvVar10);
            paVar2 = paVar13->mRootNode;
            pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                      operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  *)&i,(ulong)local_108);
            AddNodeHashes(paVar2,&pvVar10->hashes);
            anim._4_4_ = 0;
            while( true ) {
              uVar7 = anim._4_4_;
              pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                        operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    *)&i,(ulong)local_108);
              paVar13 = SceneHelper::operator->(pvVar10);
              if (paVar13->mNumAnimations <= uVar7) break;
              pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                        operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    *)&i,(ulong)local_108);
              paVar13 = SceneHelper::operator->(pvVar10);
              local_118 = paVar13->mAnimations[anim._4_4_];
              pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                        operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    *)&i,(ulong)local_108);
              local_11c = SuperFastHash((local_118->mName).data,(local_118->mName).length,0);
              std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        (&pvVar10->hashes,&local_11c);
              anim._4_4_ = anim._4_4_ + 1;
            }
          }
        }
      }
      for (cur._0_4_ = 0;
          sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                            ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i
                            ), (uint)cur < sVar9; cur._0_4_ = (uint)cur + 1) {
        pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                            ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i
                             ,(ulong)(uint)cur);
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                             (ulong)(uint)cur);
        if (((uint)cur == *pvVar12) || ((flags & 4) != 0)) {
          paVar13 = SceneHelper::operator->(pvVar10);
          *(uint *)&((src.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_parent =
               *(int *)&((src.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.
                        super__Rb_tree_header._M_header._M_parent + paVar13->mNumTextures;
          paVar13 = SceneHelper::operator->(pvVar10);
          *(uint *)((src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 0x18) =
               *(int *)((src.
                         super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->id + 0x18) +
               paVar13->mNumMaterials;
          paVar13 = SceneHelper::operator->(pvVar10);
          *(uint *)((src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8) =
               paVar13->mNumMeshes +
               *(int *)((src.
                         super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8);
        }
        paVar13 = SceneHelper::operator->(pvVar10);
        *(uint *)&((src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_right =
             *(int *)&((src.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_right + paVar13->mNumLights;
        paVar13 = SceneHelper::operator->(pvVar10);
        *(uint *)&src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage[1].scene =
             *(int *)&src.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[1].scene +
             paVar13->mNumCameras;
        paVar13 = SceneHelper::operator->(pvVar10);
        *(uint *)&((src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl =
             *(int *)&((src.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl +
             paVar13->mNumAnimations;
        paVar13 = SceneHelper::operator->(pvVar10);
        if ((paVar13->mFlags & 8) != 0) {
          *(uint *)&(src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->scene =
               *(uint *)&(src.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->scene | 8;
        }
      }
      if (*(int *)&((src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.
                   super__Rb_tree_header._M_header._M_parent != 0) {
        p_Stack_148 = (_Base_ptr)
                      operator_new__((ulong)*(uint *)((src.
                                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->id + 0x18) << 3);
        ((src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.super__Rb_tree_header.
        _M_header._M_left = p_Stack_148;
        cur._4_4_ = 0;
        for (cur_1._4_4_ = 0;
            sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                              ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i), cur_1._4_4_ < sVar9; cur_1._4_4_ = cur_1._4_4_ + 1) {
          pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                    operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i,(ulong)cur_1._4_4_);
          for (pip_1._4_4_ = 0; paVar13 = SceneHelper::operator->(pvVar10),
              pip_1._4_4_ < paVar13->mNumTextures; pip_1._4_4_ = pip_1._4_4_ + 1) {
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                                 (ulong)cur_1._4_4_);
            if (cur_1._4_4_ == *pvVar12) {
              paVar13 = SceneHelper::operator->(pvVar10);
              *(aiTexture **)p_Stack_148 = paVar13->mTextures[pip_1._4_4_];
LAB_002393bc:
              p_Stack_148 = (_Base_ptr)&p_Stack_148->_M_parent;
            }
            else if ((flags & 4) != 0) {
              paVar13 = SceneHelper::operator->(pvVar10);
              Copy((aiTexture **)p_Stack_148,paVar13->mTextures[pip_1._4_4_]);
              goto LAB_002393bc;
            }
          }
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)cur_1._4_4_);
          *pvVar12 = cur._4_4_;
          cur._4_4_ = (value_type)
                      ((long)p_Stack_148 -
                       (long)((src.
                               super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t.
                             _M_impl.super__Rb_tree_header._M_header._M_left >> 3);
        }
      }
      if (*(int *)((src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 0x18) != 0) {
        ppaStack_168 = (aiMaterial **)
                       operator_new__((ulong)*(uint *)((src.
                                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->id + 0x18) << 3);
        *(aiMaterial ***)
         &(src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage)->idlen = ppaStack_168;
        cur._4_4_ = 0;
        for (cur_2._4_4_ = 0;
            sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                              ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i), cur_2._4_4_ < sVar9; cur_2._4_4_ = cur_2._4_4_ + 1) {
          pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                    operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i,(ulong)cur_2._4_4_);
          for (prop._4_4_ = 0; paVar13 = SceneHelper::operator->(pvVar10),
              prop._4_4_ < paVar13->mNumMaterials; prop._4_4_ = prop._4_4_ + 1) {
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                                 (ulong)cur_2._4_4_);
            if (cur_2._4_4_ == *pvVar12) {
              paVar13 = SceneHelper::operator->(pvVar10);
              *ppaStack_168 = paVar13->mMaterials[prop._4_4_];
LAB_002395cc:
              paVar13 = SceneHelper::operator->(pvVar10);
              if (paVar13->mNumTextures !=
                  *(uint *)&((src.
                              super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t.
                            _M_impl.super__Rb_tree_header._M_header._M_parent) {
                for (prop._0_4_ = 0; (uint)prop < (*ppaStack_168)->mNumProperties;
                    prop._0_4_ = (uint)prop + 1) {
                  paVar3 = (*ppaStack_168)->mProperties[(uint)prop];
                  iVar8 = strncmp((paVar3->mKey).data,"$tex.file",9);
                  if (iVar8 == 0) {
                    pcVar4 = paVar3->mData;
                    if (pcVar4[4] == '*') {
                      uVar7 = strtoul10(pcVar4 + 5,(char **)0x0);
                      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           &i_1,(ulong)cur_2._4_4_);
                      ASSIMP_itoa10(pcVar4 + 5,0x3ff,uVar7 + *pvVar12);
                    }
                  }
                  else {
                    iVar8 = strcmp((paVar3->mKey).data,"$mat.name");
                    if ((iVar8 == 0) && ((flags & 2) != 0)) {
                      PrefixString((aiString *)paVar3->mData,pvVar10->id,pvVar10->idlen);
                    }
                  }
                }
              }
              ppaStack_168 = ppaStack_168 + 1;
            }
            else if ((flags & 4) != 0) {
              paVar13 = SceneHelper::operator->(pvVar10);
              Copy(ppaStack_168,paVar13->mMaterials[prop._4_4_]);
              goto LAB_002395cc;
            }
          }
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)cur_2._4_4_);
          *pvVar12 = cur._4_4_;
          cur._4_4_ = (value_type)
                      ((long)ppaStack_168 -
                       *(long *)&(src.
                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->idlen >> 3);
        }
      }
      if (*(int *)((src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8) != 0) {
        ppaStack_1a8 = (aiMesh **)
                       operator_new__((ulong)*(uint *)((src.
                                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->id + 8) << 3);
        *(aiMesh ***)
         ((src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage)->id + 0x10) = ppaStack_1a8;
        cur._4_4_ = 0;
        for (cur_3._4_4_ = 0;
            sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                              ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i), cur_3._4_4_ < sVar9; cur_3._4_4_ = cur_3._4_4_ + 1) {
          pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                    operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i,(ulong)cur_3._4_4_);
          for (nodes.
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              uVar7 = nodes.
                      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
              paVar13 = SceneHelper::operator->(pvVar10), uVar7 < paVar13->mNumMeshes;
              nodes.
              super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   nodes.
                   super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                                 (ulong)cur_3._4_4_);
            if (cur_3._4_4_ == *pvVar12) {
              paVar13 = SceneHelper::operator->(pvVar10);
              *ppaStack_1a8 =
                   paVar13->mMeshes
                   [nodes.
                    super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_];
LAB_0023996f:
              pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                                   (ulong)cur_3._4_4_);
              (*ppaStack_1a8)->mMaterialIndex = *pvVar12 + (*ppaStack_1a8)->mMaterialIndex;
              ppaStack_1a8 = ppaStack_1a8 + 1;
            }
            else if ((flags & 4) != 0) {
              paVar13 = SceneHelper::operator->(pvVar10);
              Copy(ppaStack_1a8,
                   paVar13->mMeshes
                   [nodes.
                    super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
              goto LAB_0023996f;
            }
          }
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)cur_3._4_4_);
          *pvVar12 = cur._4_4_;
          cur._4_4_ = (value_type)
                      ((long)ppaStack_1a8 -
                       *(long *)((src.
                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->id + 0x10) >>
                      3);
        }
      }
      std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::vector
                ((vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> *)
                 &ppLights);
      sVar9 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::size
                        (srcList);
      std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::reserve
                ((vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> *)
                 &ppLights,sVar9);
      ppCameras._7_1_ = 0;
      bVar6 = *(int *)&((src.
                         super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_right == 0;
      if (bVar6) {
        local_648 = (aiLight **)0x0;
      }
      else {
        uVar16 = (ulong)*(uint *)&((src.
                                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes).
                                  _M_t._M_impl.super__Rb_tree_header._M_header._M_right << 3;
        local_648 = (aiLight **)operator_new__(uVar16);
        local_1f0 = uVar16;
        local_1e8 = local_648;
      }
      ppCameras._7_1_ = !bVar6;
      ((src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = (size_t)local_648;
      local_1e0 = local_648;
      ppAnims._7_1_ = 0;
      bVar6 = *(int *)&src.
                       super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[1].scene == 0;
      if (bVar6) {
        local_660 = (aiCamera **)0x0;
      }
      else {
        uVar16 = (ulong)*(uint *)&src.
                                  super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].scene << 3;
        local_660 = (aiCamera **)operator_new__(uVar16);
        local_210 = uVar16;
        local_208 = local_660;
      }
      ppAnims._7_1_ = !bVar6;
      *(aiCamera ***)
       src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage[1].id = local_660;
      local_200 = local_660;
      cur_4._7_1_ = 0;
      bVar6 = *(int *)&((src.
                         super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl
              == 0;
      if (bVar6) {
        local_678 = (aiAnimation **)0x0;
      }
      else {
        uVar16 = (ulong)*(uint *)&((src.
                                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->hashes).
                                  _M_t._M_impl << 3;
        local_678 = (aiAnimation **)operator_new__(uVar16);
        _n_4 = uVar16;
        local_228 = local_678;
      }
      cur_4._7_1_ = !bVar6;
      *(aiAnimation ***)
       &((src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)->hashes)._M_t._M_impl.super__Rb_tree_header.
        _M_header = local_678;
      local_220 = local_678;
      sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                        ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i);
      cur_4._0_4_ = (value_type)sVar9;
      while (cur_4._0_4_ = (value_type)cur_4 - 1, -1 < (int)(value_type)cur_4) {
        node = (aiNode *)
               std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::operator[]
                         ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i,
                          (long)(int)(value_type)cur_4);
        vVar1 = (value_type)cur_4;
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                             (long)(int)(value_type)cur_4);
        if (vVar1 == *pvVar12) {
          paVar13 = SceneHelper::operator->((SceneHelper *)node);
          paVar2 = paVar13->mRootNode;
          local_248 = paVar2;
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (long)(int)(value_type)cur_4);
          OffsetNodeMeshIndices(paVar2,*pvVar12);
        }
        else {
          paVar13 = SceneHelper::operator->((SceneHelper *)node);
          Copy(&local_248,paVar13->mRootNode);
          paVar2 = local_248;
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                               (long)(int)(value_type)cur_4);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                               (ulong)*pvVar12);
          OffsetNodeMeshIndices(paVar2,*pvVar12);
          paVar2 = local_248;
          if ((flags & 4) != 0) {
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                                 (long)(int)(value_type)cur_4);
            vVar1 = *pvVar12;
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                                 (long)(int)(value_type)cur_4);
            pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,
                                 (ulong)*pvVar12);
            OffsetNodeMeshIndices(paVar2,vVar1 - *pvVar12);
          }
        }
        paVar2 = local_248;
        if ((value_type)cur_4 != 0) {
          pvVar11 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
                    operator[](srcList,(long)(int)((value_type)cur_4 - 1));
          NodeAttachmentInfo::NodeAttachmentInfo
                    ((NodeAttachmentInfo *)local_268,paVar2,pvVar11->attachToNode,
                     (long)(int)(value_type)cur_4);
          std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::
          push_back((vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                     *)&ppLights,(value_type *)local_268);
        }
        if ((flags & 1) != 0) {
          if ((flags & 0x10) == 0) {
            AddNodePrefixes(local_248,(node->mName).data + 4,*(uint *)((node->mName).data + 0x24));
          }
          else {
            AddNodePrefixesChecked
                      (local_248,(node->mName).data + 4,*(uint *)((node->mName).data + 0x24),
                       (vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i,
                       (value_type)cur_4);
          }
          for (mesh._4_4_ = 0; paVar13 = SceneHelper::operator->((SceneHelper *)node),
              mesh._4_4_ < paVar13->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
            paVar13 = SceneHelper::operator->((SceneHelper *)node);
            paVar5 = paVar13->mMeshes[mesh._4_4_];
            for (i_8 = 0; i_8 < paVar5->mNumBones; i_8 = i_8 + 1) {
              if (((flags & 0x10) == 0) ||
                 (bVar6 = FindNameMatch(&paVar5->mBones[i_8]->mName,
                                        (vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                         *)&i,(value_type)cur_4), bVar6)) {
                PrefixString(&paVar5->mBones[i_8]->mName,(node->mName).data + 4,
                             *(uint *)((node->mName).data + 0x24));
              }
            }
          }
        }
        for (i_9 = 0; paVar13 = SceneHelper::operator->((SceneHelper *)node),
            vVar1 = (value_type)cur_4, i_9 < paVar13->mNumLights; i_9 = i_9 + 1) {
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                               (long)(int)(value_type)cur_4);
          _dest_02 = local_1e0;
          if (vVar1 == *pvVar12) {
            paVar13 = SceneHelper::operator->((SceneHelper *)node);
            *local_1e0 = paVar13->mLights[i_9];
          }
          else {
            paVar13 = SceneHelper::operator->((SceneHelper *)node);
            Copy(_dest_02,paVar13->mLights[i_9]);
          }
          if (((flags & 1) != 0) &&
             (((flags & 0x10) == 0 ||
              (bVar6 = FindNameMatch(&(*local_1e0)->mName,
                                     (vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                      *)&i,(value_type)cur_4), bVar6)))) {
            PrefixString(&(*local_1e0)->mName,(node->mName).data + 4,
                         *(uint *)((node->mName).data + 0x24));
          }
          local_1e0 = local_1e0 + 1;
        }
        for (a_4 = 0; paVar13 = SceneHelper::operator->((SceneHelper *)node),
            vVar1 = (value_type)cur_4, a_4 < paVar13->mNumCameras; a_4 = a_4 + 1) {
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                               (long)(int)(value_type)cur_4);
          _dest_01 = local_200;
          if (vVar1 == *pvVar12) {
            paVar13 = SceneHelper::operator->((SceneHelper *)node);
            *local_200 = paVar13->mCameras[a_4];
          }
          else {
            paVar13 = SceneHelper::operator->((SceneHelper *)node);
            Copy(_dest_01,paVar13->mCameras[a_4]);
          }
          if (((flags & 1) != 0) &&
             (((flags & 0x10) == 0 ||
              (bVar6 = FindNameMatch(&(*local_200)->mName,
                                     (vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                      *)&i,(value_type)cur_4), bVar6)))) {
            PrefixString(&(*local_200)->mName,(node->mName).data + 4,
                         *(uint *)((node->mName).data + 0x24));
          }
          local_200 = local_200 + 1;
        }
        for (local_288 = 0; paVar13 = SceneHelper::operator->((SceneHelper *)node),
            vVar1 = (value_type)cur_4, local_288 < paVar13->mNumAnimations;
            local_288 = local_288 + 1) {
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                               (long)(int)(value_type)cur_4);
          _dest_00 = local_220;
          if (vVar1 == *pvVar12) {
            paVar13 = SceneHelper::operator->((SceneHelper *)node);
            *local_220 = paVar13->mAnimations[local_288];
          }
          else {
            paVar13 = SceneHelper::operator->((SceneHelper *)node);
            Copy(_dest_00,paVar13->mAnimations[local_288]);
          }
          if (((flags & 1) != 0) &&
             (((flags & 0x10) == 0 ||
              (bVar6 = FindNameMatch(&(*local_220)->mName,
                                     (vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                      *)&i,(value_type)cur_4), bVar6)))) {
            PrefixString(&(*local_220)->mName,(node->mName).data + 4,
                         *(uint *)((node->mName).data + 0x24));
            for (it._M_current._4_4_ = 0; it._M_current._4_4_ < (*local_220)->mNumChannels;
                it._M_current._4_4_ = it._M_current._4_4_ + 1) {
              if (((flags & 0x10) == 0) ||
                 (bVar6 = FindNameMatch(&(*local_220)->mChannels[it._M_current._4_4_]->mNodeName,
                                        (vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                         *)&i,(value_type)cur_4), bVar6)) {
                PrefixString(&(*local_220)->mChannels[it._M_current._4_4_]->mNodeName,
                             (node->mName).data + 4,*(uint *)((node->mName).data + 0x24));
              }
            }
          }
          local_220 = local_220 + 1;
        }
      }
      AttachToGraph(master,(vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                            *)&ppLights);
      *(aiNode **)
       (src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage)->id = master->mRootNode;
      local_298._M_current =
           (NodeAttachmentInfo *)
           std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::
           begin((vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> *)
                 &ppLights);
      while( true ) {
        iStack_2a0 = std::
                     vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                     ::end((vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                            *)&ppLights);
        bVar6 = __gnu_cxx::operator!=(&local_298,&stack0xfffffffffffffd60);
        if (!bVar6) break;
        pNVar14 = __gnu_cxx::
                  __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                  ::operator*(&local_298);
        if ((pNVar14->resolved & 1U) == 0) {
          if ((flags & 8) != 0) {
            for (local_2a4 = 0; uVar16 = (ulong)local_2a4,
                sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                                  ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                    *)&i), uVar16 < sVar9; local_2a4 = local_2a4 + 1) {
              uVar16 = (ulong)local_2a4;
              pNVar14 = __gnu_cxx::
                        __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                        ::operator*(&local_298);
              if (uVar16 != pNVar14->src_idx) {
                pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                          operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                      *)&i,(ulong)local_2a4);
                AttachToGraph(pvVar10->scene,
                              (vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                               *)&ppLights);
                pNVar14 = __gnu_cxx::
                          __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                          ::operator*(&local_298);
                if ((pNVar14->resolved & 1U) != 0) break;
              }
            }
          }
          pNVar14 = __gnu_cxx::
                    __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                    ::operator*(&local_298);
          if ((pNVar14->resolved & 1U) == 0) {
            this_00 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[45]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_440,(char (*) [45])"SceneCombiner: Failed to resolve attachment ");
            pNVar14 = __gnu_cxx::
                      __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                      ::operator*(&local_298);
            pbVar15 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_440,&(pNVar14->node->mName).data);
            pbVar15 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar15,(char (*) [2])0x2bc7c1);
            pNVar14 = __gnu_cxx::
                      __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
                      ::operator*(&local_298);
            this_01 = (basic_formatter *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar15,&(pNVar14->attachToNode->mName).data);
            Formatter::basic_formatter::operator_cast_to_string(&local_2c8,this_01);
            Logger::error(this_00,&local_2c8);
            std::__cxx11::string::~string((string *)&local_2c8);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *
                             )local_440);
          }
        }
        __gnu_cxx::
        __normal_iterator<Assimp::NodeAttachmentInfo_*,_std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>_>
        ::operator++(&local_298);
      }
      for (deleteMe._4_4_ = 0;
          sVar9 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::size
                            ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i
                            ), deleteMe._4_4_ < sVar9; deleteMe._4_4_ = deleteMe._4_4_ + 1) {
        pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                             (ulong)deleteMe._4_4_);
        if (deleteMe._4_4_ == *pvVar12) {
          pvVar10 = std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::
                    operator[]((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)
                               &i,(ulong)deleteMe._4_4_);
          paVar13 = pvVar10->scene;
          if (paVar13->mMeshes != (aiMesh **)0x0) {
            operator_delete__(paVar13->mMeshes);
          }
          paVar13->mMeshes = (aiMesh **)0x0;
          if (paVar13->mCameras != (aiCamera **)0x0) {
            operator_delete__(paVar13->mCameras);
          }
          paVar13->mCameras = (aiCamera **)0x0;
          if (paVar13->mLights != (aiLight **)0x0) {
            operator_delete__(paVar13->mLights);
          }
          paVar13->mLights = (aiLight **)0x0;
          if (paVar13->mMaterials != (aiMaterial **)0x0) {
            operator_delete__(paVar13->mMaterials);
          }
          paVar13->mMaterials = (aiMaterial **)0x0;
          if (paVar13->mAnimations != (aiAnimation **)0x0) {
            operator_delete__(paVar13->mAnimations);
          }
          paVar13->mAnimations = (aiAnimation **)0x0;
          paVar13->mRootNode = (aiNode *)0x0;
          if (paVar13 != (aiScene *)0x0) {
            aiScene::~aiScene(paVar13);
            operator_delete(paVar13);
          }
        }
      }
      if ((*(int *)((src.
                     super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8) == 0) ||
         (*(int *)((src.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 0x18) == 0)) {
        *(uint *)&(src.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->scene =
             *(uint *)&(src.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->scene | 1;
      }
      std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::~vector
                ((vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> *)
                 &ppLights);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::~vector
                ((vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *)&i);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeScenes(aiScene** _dest, aiScene* master, std::vector<AttachmentInfo>& srcList, unsigned int flags) {
    if ( nullptr == _dest ) {
        return;
    }

    // if _dest points to NULL allocate a new scene. Otherwise clear the old and reuse it
    if (srcList.empty())    {
        if (*_dest) {
            SceneCombiner::CopySceneFlat(_dest,master);
        }
        else *_dest = master;
        return;
    }
    if (*_dest) {
        (*_dest)->~aiScene();
        new (*_dest) aiScene();
    }
    else *_dest = new aiScene();

    aiScene* dest = *_dest;

    std::vector<SceneHelper> src (srcList.size()+1);
    src[0].scene = master;
    for (unsigned int i = 0; i < srcList.size();++i)    {
        src[i+1] = SceneHelper( srcList[i].scene );
    }

    // this helper array specifies which scenes are duplicates of others
    std::vector<unsigned int> duplicates(src.size(),UINT_MAX);

    // this helper array is used as lookup table several times
    std::vector<unsigned int> offset(src.size());

    // Find duplicate scenes
    for (unsigned int i = 0; i < src.size();++i) {
        if (duplicates[i] != i && duplicates[i] != UINT_MAX) {
            continue;
        }

        duplicates[i] = i;
        for ( unsigned int a = i+1; a < src.size(); ++a)    {
            if (src[i].scene == src[a].scene) {
                duplicates[a] = i;
            }
        }
    }

    // Generate unique names for all named stuff?
    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES)
    {
#if 0
        // Construct a proper random number generator
        boost::mt19937 rng(  );
        boost::uniform_int<> dist(1u,1 << 24u);
        boost::variate_generator<boost::mt19937&, boost::uniform_int<> > rndGen(rng, dist);
#endif
        for (unsigned int i = 1; i < src.size();++i)
        {
            //if (i != duplicates[i])
            //{
            //  // duplicate scenes share the same UID
            //  ::strcpy( src[i].id, src[duplicates[i]].id );
            //  src[i].idlen = src[duplicates[i]].idlen;

            //  continue;
            //}

            src[i].idlen = ai_snprintf(src[i].id, 32, "$%.6X$_",i);

            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {

                // Compute hashes for all identifiers in this scene and store them
                // in a sorted table (for convenience I'm using std::set). We hash
                // just the node and animation channel names, all identifiers except
                // the material names should be caught by doing this.
                AddNodeHashes(src[i]->mRootNode,src[i].hashes);

                for (unsigned int a = 0; a < src[i]->mNumAnimations;++a) {
                    aiAnimation* anim = src[i]->mAnimations[a];
                    src[i].hashes.insert(SuperFastHash(anim->mName.data,static_cast<uint32_t>(anim->mName.length)));
                }
            }
        }
    }

    unsigned int cnt;

    // First find out how large the respective output arrays must be
    for ( unsigned int n = 0; n < src.size();++n )
    {
        SceneHelper* cur = &src[n];

        if (n == duplicates[n] || flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)   {
            dest->mNumTextures   += (*cur)->mNumTextures;
            dest->mNumMaterials  += (*cur)->mNumMaterials;
            dest->mNumMeshes     += (*cur)->mNumMeshes;
        }

        dest->mNumLights     += (*cur)->mNumLights;
        dest->mNumCameras    += (*cur)->mNumCameras;
        dest->mNumAnimations += (*cur)->mNumAnimations;

        // Combine the flags of all scenes
        // We need to process them flag-by-flag here to get correct results
        // dest->mFlags ; //|= (*cur)->mFlags;
        if ((*cur)->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
            dest->mFlags |= AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
        }
    }

    // generate the output texture list + an offset table for all texture indices
    if (dest->mNumTextures)
    {
        aiTexture** pip = dest->mTextures = new aiTexture*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumTextures;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mTextures[i]);

                    else continue;
                }
                else *pip = (*cur)->mTextures[i];
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mTextures);
        }
    }

    // generate the output material list + an offset table for all material indices
    if (dest->mNumMaterials)
    {
        aiMaterial** pip = dest->mMaterials = new aiMaterial*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )  {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMaterials;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mMaterials[i]);

                    else continue;
                }
                else *pip = (*cur)->mMaterials[i];

                if ((*cur)->mNumTextures != dest->mNumTextures)     {
                    // We need to update all texture indices of the mesh. So we need to search for
                    // a material property called '$tex.file'

                    for (unsigned int a = 0; a < (*pip)->mNumProperties;++a)
                    {
                        aiMaterialProperty* prop = (*pip)->mProperties[a];
                        if (!strncmp(prop->mKey.data,"$tex.file",9))
                        {
                            // Check whether this texture is an embedded texture.
                            // In this case the property looks like this: *<n>,
                            // where n is the index of the texture.
                            aiString& s = *((aiString*)prop->mData);
                            if ('*' == s.data[0])   {
                                // Offset the index and write it back ..
                                const unsigned int idx = strtoul10(&s.data[1]) + offset[n];
                                ASSIMP_itoa10(&s.data[1],sizeof(s.data)-1,idx);
                            }
                        }

                        // Need to generate new, unique material names?
                        else if (!::strcmp( prop->mKey.data,"$mat.name" ) && flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES)
                        {
                            aiString* pcSrc = (aiString*) prop->mData;
                            PrefixString(*pcSrc, (*cur).id, (*cur).idlen);
                        }
                    }
                }
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMaterials);
        }
    }

    // generate the output mesh list + again an offset table for all mesh indices
    if (dest->mNumMeshes)
    {
        aiMesh** pip = dest->mMeshes = new aiMesh*[dest->mNumMeshes];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)
            {
                if (n != duplicates[n]) {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip, (*cur)->mMeshes[i]);

                    else continue;
                }
                else *pip = (*cur)->mMeshes[i];

                // update the material index of the mesh
                (*pip)->mMaterialIndex +=  offset[n];
                ++pip;
            }

            // reuse the offset array - store now the mesh offset in it
            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMeshes);
        }
    }

    std::vector <NodeAttachmentInfo> nodes;
    nodes.reserve(srcList.size());

    // ----------------------------------------------------------------------------
    // Now generate the output node graph. We need to make those
    // names in the graph that are referenced by anims or lights
    // or cameras unique. So we add a prefix to them ... $<rand>_
    // We could also use a counter, but using a random value allows us to
    // use just one prefix if we are joining multiple scene hierarchies recursively.
    // Chances are quite good we don't collide, so we try that ...
    // ----------------------------------------------------------------------------

    // Allocate space for light sources, cameras and animations
    aiLight** ppLights = dest->mLights = (dest->mNumLights
        ? new aiLight*[dest->mNumLights] : NULL);

    aiCamera** ppCameras = dest->mCameras = (dest->mNumCameras
        ? new aiCamera*[dest->mNumCameras] : NULL);

    aiAnimation** ppAnims = dest->mAnimations = (dest->mNumAnimations
        ? new aiAnimation*[dest->mNumAnimations] : NULL);

    for ( int n = static_cast<int>(src.size()-1); n >= 0 ;--n ) /* !!! important !!! */
    {
        SceneHelper* cur = &src[n];
        aiNode* node;

        // To offset or not to offset, this is the question
        if (n != (int)duplicates[n])
        {
            // Get full scene-graph copy
            Copy( &node, (*cur)->mRootNode );
            OffsetNodeMeshIndices(node,offset[duplicates[n]]);

            if (flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY) {
                // (note:) they are already 'offseted' by offset[duplicates[n]]
                OffsetNodeMeshIndices(node,offset[n] - offset[duplicates[n]]);
            }
        }
        else // if (n == duplicates[n])
        {
            node = (*cur)->mRootNode;
            OffsetNodeMeshIndices(node,offset[n]);
        }
        if (n) // src[0] is the master node
            nodes.push_back(NodeAttachmentInfo( node,srcList[n-1].attachToNode,n ));

        // add name prefixes?
        if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {

            // or the whole scenegraph
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                AddNodePrefixesChecked(node,(*cur).id,(*cur).idlen,src,n);
            }
            else AddNodePrefixes(node,(*cur).id,(*cur).idlen);

            // meshes
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)    {
                aiMesh* mesh = (*cur)->mMeshes[i];

                // rename all bones
                for (unsigned int a = 0; a < mesh->mNumBones;++a)   {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch(mesh->mBones[a]->mName,src,n))
                            continue;
                    }
                    PrefixString(mesh->mBones[a]->mName,(*cur).id,(*cur).idlen);
                }
            }
        }

        // --------------------------------------------------------------------
        // Copy light sources
        for (unsigned int i = 0; i < (*cur)->mNumLights;++i,++ppLights)
        {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppLights, (*cur)->mLights[i]);
            }
            else *ppLights = (*cur)->mLights[i];


            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppLights)->mName,src,n))
                        continue;
                }

                PrefixString((*ppLights)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy cameras
        for (unsigned int i = 0; i < (*cur)->mNumCameras;++i,++ppCameras)   {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppCameras, (*cur)->mCameras[i]);
            }
            else *ppCameras = (*cur)->mCameras[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppCameras)->mName,src,n))
                        continue;
                }

                PrefixString((*ppCameras)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy animations
        for (unsigned int i = 0; i < (*cur)->mNumAnimations;++i,++ppAnims)  {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppAnims, (*cur)->mAnimations[i]);
            }
            else *ppAnims = (*cur)->mAnimations[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppAnims)->mName,src,n))
                        continue;
                }

                PrefixString((*ppAnims)->mName,(*cur).id,(*cur).idlen);

                // don't forget to update all node animation channels
                for (unsigned int a = 0; a < (*ppAnims)->mNumChannels;++a) {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch((*ppAnims)->mChannels[a]->mNodeName,src,n))
                            continue;
                    }

                    PrefixString((*ppAnims)->mChannels[a]->mNodeName,(*cur).id,(*cur).idlen);
                }
            }
        }
    }

    // Now build the output graph
    AttachToGraph ( master, nodes);
    dest->mRootNode = master->mRootNode;

    // Check whether we succeeded at building the output graph
    for (std::vector <NodeAttachmentInfo> ::iterator it = nodes.begin();
        it != nodes.end(); ++it)
    {
        if (!(*it).resolved) {
            if (flags & AI_INT_MERGE_SCENE_RESOLVE_CROSS_ATTACHMENTS) {
                // search for this attachment point in all other imported scenes, too.
                for ( unsigned int n = 0; n < src.size();++n ) {
                    if (n != (*it).src_idx) {
                        AttachToGraph(src[n].scene,nodes);
                        if ((*it).resolved)
                            break;
                    }
                }
            }
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F( "SceneCombiner: Failed to resolve attachment ", (*it).node->mName.data,
                    " ", (*it).attachToNode->mName.data );
            }
        }
    }

    // now delete all input scenes. Make sure duplicate scenes aren't
    // deleted more than one time
    for ( unsigned int n = 0; n < src.size();++n )  {
        if (n != duplicates[n]) // duplicate scene?
            continue;

        aiScene* deleteMe = src[n].scene;

        // We need to delete the arrays before the destructor is called -
        // we are reusing the array members
        delete[] deleteMe->mMeshes;     deleteMe->mMeshes     = NULL;
        delete[] deleteMe->mCameras;    deleteMe->mCameras    = NULL;
        delete[] deleteMe->mLights;     deleteMe->mLights     = NULL;
        delete[] deleteMe->mMaterials;  deleteMe->mMaterials  = NULL;
        delete[] deleteMe->mAnimations; deleteMe->mAnimations = NULL;

        deleteMe->mRootNode = NULL;

        // Now we can safely delete the scene
        delete deleteMe;
    }

    // Check flags
    if (!dest->mNumMeshes || !dest->mNumMaterials) {
        dest->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    // We're finished
}